

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int stbi_png_test_file(FILE *f)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = ftell((FILE *)f);
  lVar4 = 0;
  while( true ) {
    uVar2 = 0;
    if ((f != (FILE *)0x0) && (uVar2 = fgetc((FILE *)f), uVar2 == 0xffffffff)) {
      uVar2 = 0;
    }
    bVar1 = (&check_png_header_png_sig)[lVar4];
    if (uVar2 != bVar1) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 8) {
LAB_00148828:
      fseek((FILE *)f,(long)(int)lVar3,0);
      return (int)(uVar2 == bVar1);
    }
  }
  failure_reason = "Not a PNG";
  goto LAB_00148828;
}

Assistant:

int stbi_png_test_file(FILE *f)
{
   png p;
   int n,r;
   n = ftell(f);
   start_file(&p.s, f);
   r = parse_png_file(&p, SCAN_type,STBI_default);
   fseek(f,n,SEEK_SET);
   return r;
}